

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

CURLcode deflate_unencode_write(Curl_easy *data,contenc_writer *writer,char *buf,size_t nbytes)

{
  z_stream *z;
  zlib_writer *zp;
  size_t nbytes_local;
  char *buf_local;
  contenc_writer *writer_local;
  Curl_easy *data_local;
  
  writer[1].downstream = (contenc_writer *)buf;
  *(int *)&writer[2].handler = (int)nbytes;
  if (*(int *)&writer[1].handler == 3) {
    data_local._4_4_ = process_trailer(data,(zlib_writer *)writer);
  }
  else {
    data_local._4_4_ = inflate_stream(data,writer,ZLIB_INFLATING);
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode deflate_unencode_write(struct Curl_easy *data,
                                       struct contenc_writer *writer,
                                       const char *buf, size_t nbytes)
{
  struct zlib_writer *zp = (struct zlib_writer *) writer;
  z_stream *z = &zp->z;     /* zlib state structure */

  /* Set the compressed input when this function is called */
  z->next_in = (Bytef *) buf;
  z->avail_in = (uInt) nbytes;

  if(zp->zlib_init == ZLIB_EXTERNAL_TRAILER)
    return process_trailer(data, zp);

  /* Now uncompress the data */
  return inflate_stream(data, writer, ZLIB_INFLATING);
}